

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O1

wchar_t borg_extract_dir(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  wchar_t wVar1;
  
  if (x1 != x2 || y1 != y2) {
    if (x1 == x2) {
      wVar1 = L'\b';
      if (y1 < y2) {
        wVar1 = L'\x02';
      }
      return wVar1;
    }
    if (y1 == y2) {
      return (uint)(x1 < x2) * 2 + L'\x04';
    }
    if (y1 < y2) {
      return (uint)(x1 < x2) * 2 + L'\x01';
    }
    if (y2 < y1) {
      return (uint)(x1 < x2) * 2 + L'\a';
    }
  }
  return L'\x05';
}

Assistant:

int borg_extract_dir(int y1, int x1, int y2, int x2)
{
    /* No movement required */
    if ((y1 == y2) && (x1 == x2))
        return 5;

    /* South or North */
    if (x1 == x2)
        return ((y1 < y2) ? 2 : 8);

    /* East or West */
    if (y1 == y2)
        return ((x1 < x2) ? 6 : 4);

    /* South-east or South-west */
    if (y1 < y2)
        return ((x1 < x2) ? 3 : 1);

    /* North-east or North-west */
    if (y1 > y2)
        return ((x1 < x2) ? 9 : 7);

    /* Paranoia */
    return 5;
}